

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_cloud_cover.cpp
# Opt level: O3

int main(int argc,char **argv)

{
  int iVar1;
  double dVar2;
  ANNpoint pAVar3;
  ostream *poVar4;
  long lVar5;
  int i;
  undefined1 auVar6 [8];
  ulong uVar7;
  uint uVar8;
  long lVar9;
  long lVar10;
  undefined1 auVar11 [16];
  undefined1 auVar12 [16];
  undefined1 auVar13 [16];
  void **local_4e8;
  long alStack_4e0 [15];
  void *apvStack_468 [16];
  int *local_3e8;
  long alStack_3e0 [15];
  int local_368 [16];
  ANNpoint local_328;
  long alStack_320 [15];
  ANNcoord local_2a8 [15];
  undefined1 *puStack_230;
  undefined1 local_228 [8];
  MultiANN MAG;
  int topology [4];
  string local_c8;
  undefined1 local_a8 [8];
  vector<Quaternion,_std::allocator<Quaternion>_> cloud;
  int idx_ann;
  double local_80;
  double d_ann;
  vector<double_*,_std::allocator<double_*>_> pointers_to_points;
  string filename;
  ANNpoint query_pt;
  
  pointers_to_points.super__Vector_base<double_*,_std::allocator<double_*>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)&filename._M_string_length;
  filename._M_dataplus._M_p = (pointer)0x0;
  filename._M_string_length._0_1_ = 0;
  if (argc == 2) {
    puStack_230 = (undefined1 *)0x104c5d;
    std::__cxx11::string::string((string *)local_228,argv[1],(allocator *)(topology + 2));
    puStack_230 = (undefined1 *)0x104c70;
    std::__cxx11::string::operator=
              ((string *)
               &pointers_to_points.super__Vector_base<double_*,_std::allocator<double_*>_>._M_impl.
                super__Vector_impl_data._M_end_of_storage,(string *)local_228);
    if (local_228 == (undefined1  [8])&MAG.LastNodeCount) goto LAB_00104c84;
  }
  else {
    if (argc != 1) {
      puStack_230 = (undefined1 *)0x105272;
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&std::cout,"Wrong number of arguments!",0x1a);
      puStack_230 = (undefined1 *)0x10527e;
      std::endl<char,std::char_traits<char>>((ostream *)&std::cout);
      puStack_230 = &LAB_00105288;
      exit(1);
    }
    puStack_230 = (undefined1 *)0x104bd9;
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cout,"Loading the quaternion file from disk...",0x28);
    puStack_230 = (undefined1 *)0x104bed;
    std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + '\b');
    puStack_230 = (undefined1 *)0x104bfc;
    std::ostream::put('\b');
    puStack_230 = (undefined1 *)0x104c04;
    std::ostream::flush();
    puStack_230 = (undefined1 *)0x104c29;
    local_228 = (undefined1  [8])&MAG.LastNodeCount;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_228,"simple_0.qua","");
    puStack_230 = (undefined1 *)0x104c3c;
    std::__cxx11::string::operator=
              ((string *)
               &pointers_to_points.super__Vector_base<double_*,_std::allocator<double_*>_>._M_impl.
                super__Vector_impl_data._M_end_of_storage,(string *)local_228);
    if (local_228 == (undefined1  [8])&MAG.LastNodeCount) goto LAB_00104c84;
  }
  puStack_230 = (undefined1 *)0x104c84;
  operator_delete((void *)local_228);
LAB_00104c84:
  puStack_230 = (undefined1 *)0x104ca6;
  local_c8._M_dataplus._M_p = (pointer)&local_c8.field_2;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_c8,
             pointers_to_points.super__Vector_base<double_*,_std::allocator<double_*>_>._M_impl.
             super__Vector_impl_data._M_end_of_storage,
             filename._M_dataplus._M_p +
             (long)pointers_to_points.super__Vector_base<double_*,_std::allocator<double_*>_>.
                   _M_impl.super__Vector_impl_data._M_end_of_storage);
  puStack_230 = (undefined1 *)0x104cb9;
  load_quaternion_cloud((vector<Quaternion,_std::allocator<Quaternion>_> *)local_a8,&local_c8);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_c8._M_dataplus._M_p != &local_c8.field_2) {
    puStack_230 = (undefined1 *)0x104cca;
    operator_delete(local_c8._M_dataplus._M_p);
  }
  d_ann = 0.0;
  pointers_to_points.super__Vector_base<double_*,_std::allocator<double_*>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  pointers_to_points.super__Vector_base<double_*,_std::allocator<double_*>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  uVar8 = (uint)((ulong)((long)cloud.super__Vector_base<Quaternion,_std::allocator<Quaternion>_>.
                               _M_impl.super__Vector_impl_data._M_start - (long)local_a8) >> 5);
  if (0 < (int)uVar8) {
    uVar7 = (ulong)(uVar8 & 0x7fffffff);
    auVar6 = local_a8;
    do {
      local_228 = auVar6;
      if (pointers_to_points.super__Vector_base<double_*,_std::allocator<double_*>_>._M_impl.
          super__Vector_impl_data._M_start ==
          pointers_to_points.super__Vector_base<double_*,_std::allocator<double_*>_>._M_impl.
          super__Vector_impl_data._M_finish) {
        puStack_230 = (undefined1 *)0x104d30;
        std::vector<double*,std::allocator<double*>>::_M_realloc_insert<double*>
                  ((vector<double*,std::allocator<double*>> *)&d_ann,
                   (iterator)
                   pointers_to_points.super__Vector_base<double_*,_std::allocator<double_*>_>.
                   _M_impl.super__Vector_impl_data._M_start,(double **)local_228);
      }
      else {
        *pointers_to_points.super__Vector_base<double_*,_std::allocator<double_*>_>._M_impl.
         super__Vector_impl_data._M_start = (double *)auVar6;
        pointers_to_points.super__Vector_base<double_*,_std::allocator<double_*>_>._M_impl.
        super__Vector_impl_data._M_start =
             pointers_to_points.super__Vector_base<double_*,_std::allocator<double_*>_>._M_impl.
             super__Vector_impl_data._M_start + 1;
      }
      auVar6 = (undefined1  [8])((long)auVar6 + 0x20);
      uVar7 = uVar7 - 1;
    } while (uVar7 != 0);
  }
  dVar2 = d_ann;
  puStack_230 = (undefined1 *)0x104d5d;
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cout,"Creating the search data structure...",0x25);
  puStack_230 = (undefined1 *)0x104d71;
  std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + '\b');
  puStack_230 = (undefined1 *)0x104d80;
  std::ostream::put('\b');
  puStack_230 = (undefined1 *)0x104d88;
  std::ostream::flush();
  MAG.AnnArray[0x1e] = (ANN *)0x300000003;
  topology[0] = 3;
  topology[1] = 3;
  topology[2] = 0;
  topology[3] = 0x3ff00000;
  puStack_230 = (undefined1 *)0x104dc9;
  MultiANN::MultiANN((MultiANN *)local_228,4,0x10,(int *)(MAG.AnnArray + 0x1e),
                     (ANNpoint)(topology + 2));
  if (0 < (int)uVar8) {
    uVar7 = 0;
    do {
      pAVar3 = *(ANNpoint *)((long)dVar2 + uVar7 * 8);
      puStack_230 = (undefined1 *)0x104dee;
      MultiANN::AddPoint((MultiANN *)local_228,pAVar3,pAVar3);
      uVar7 = uVar7 + 1;
    } while ((uVar8 & 0x7fffffff) != uVar7);
  }
  puStack_230 = (undefined1 *)0x104e11;
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cout,"Generating Random Query Point",0x1d);
  puStack_230 = (undefined1 *)0x104e25;
  std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + '\b');
  puStack_230 = (undefined1 *)0x104e34;
  std::ostream::put('\b');
  puStack_230 = (undefined1 *)0x104e3c;
  std::ostream::flush();
  puStack_230 = (undefined1 *)0x104e4a;
  filename.field_2._8_8_ = annAllocPt(4,0.0);
  *(ANNcoord *)filename.field_2._8_8_ = 0.0;
  *(ANNcoord *)(filename.field_2._8_8_ + 8) = 0.0;
  *(ANNcoord *)(filename.field_2._8_8_ + 0x10) = 0.0;
  *(ANNcoord *)(filename.field_2._8_8_ + 0x18) = 1.0;
  puStack_230 = (undefined1 *)0x104e87;
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cout,"Calling single point nearest neighbor...",0x28);
  puStack_230 = (undefined1 *)0x104e9b;
  std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + '\b');
  puStack_230 = (undefined1 *)0x104eaa;
  std::ostream::put('\b');
  puStack_230 = (undefined1 *)0x104eb2;
  std::ostream::flush();
  local_80 = INFINITY;
  puStack_230 = (undefined1 *)0x104eda;
  pAVar3 = (ANNpoint)
           MultiANN::NearestNeighbor
                     ((MultiANN *)local_228,(ANNpoint *)((long)&filename.field_2 + 8),
                      (int *)((long)&cloud.
                                     super__Vector_base<Quaternion,_std::allocator<Quaternion>_>.
                                     _M_impl.super__Vector_impl_data._M_end_of_storage + 4),
                      &local_80);
  puStack_230 = (undefined1 *)0x104ef5;
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"query_pt = ",0xb);
  puStack_230 = (undefined1 *)0x104f0a;
  printPt((ostream *)&std::cout,(ANNpoint)filename.field_2._8_8_,4);
  puStack_230 = (undefined1 *)0x104f22;
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"result_pt = ",0xc);
  puStack_230 = (undefined1 *)0x104f36;
  printPt((ostream *)&std::cout,pAVar3,4);
  puStack_230 = (undefined1 *)0x104f4e;
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"ANN distance = ",0xf);
  puStack_230 = (undefined1 *)0x104f5f;
  poVar4 = std::ostream::_M_insert<double>(local_80);
  puStack_230 = (undefined1 *)0x104f76;
  std::__ostream_insert<char,std::char_traits<char>>(poVar4," rad",4);
  puStack_230 = (undefined1 *)0x104f8a;
  std::ios::widen((char)*(undefined8 *)(*(long *)poVar4 + -0x18) + (char)poVar4);
  puStack_230 = (undefined1 *)0x104f95;
  std::ostream::put((char)poVar4);
  puStack_230 = (undefined1 *)0x104f9d;
  std::ostream::flush();
  dVar2 = local_80;
  puStack_230 = (undefined1 *)0x104fbf;
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"ANN distance = ",0xf);
  puStack_230 = (undefined1 *)0x104fe0;
  poVar4 = std::ostream::_M_insert<double>((dVar2 * 180.0) / 3.141592653589793);
  puStack_230 = (undefined1 *)0x104ff7;
  std::__ostream_insert<char,std::char_traits<char>>(poVar4," degrees",8);
  puStack_230 = (undefined1 *)0x10500b;
  std::ios::widen((char)*(undefined8 *)(*(long *)poVar4 + -0x18) + (char)poVar4);
  puStack_230 = (undefined1 *)0x105016;
  std::ostream::put((char)poVar4);
  puStack_230 = (undefined1 *)0x10501e;
  std::ostream::flush();
  puStack_230 = (undefined1 *)0x105039;
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cout,"Calling multiple point nearest neighbor...",0x2a);
  puStack_230 = (undefined1 *)0x10504d;
  std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + '\b');
  puStack_230 = (undefined1 *)0x10505c;
  std::ostream::put('\b');
  puStack_230 = (undefined1 *)0x105064;
  std::ostream::flush();
  lVar9 = 0;
  lVar10 = 1;
  lVar5 = 0;
  auVar11._8_4_ = (int)local_2a8;
  auVar11._0_8_ = local_2a8;
  auVar11._12_4_ = (int)((ulong)local_2a8 >> 0x20);
  do {
    (&local_328)[lVar5] = local_2a8 + lVar9;
    alStack_320[lVar5] = lVar10 * 8 + auVar11._8_8_;
    lVar5 = lVar5 + 2;
    lVar9 = lVar9 + 2;
    lVar10 = lVar10 + 2;
  } while (lVar5 != 0x10);
  lVar9 = 0;
  lVar10 = 1;
  lVar5 = 0;
  auVar12._8_4_ = (int)local_368;
  auVar12._0_8_ = local_368;
  auVar12._12_4_ = (int)((ulong)local_368 >> 0x20);
  do {
    (&local_3e8)[lVar5] = local_368 + lVar9;
    alStack_3e0[lVar5] = lVar10 * 4 + auVar12._8_8_;
    lVar5 = lVar5 + 2;
    lVar9 = lVar9 + 2;
    lVar10 = lVar10 + 2;
  } while (lVar5 != 0x10);
  lVar9 = 0;
  lVar10 = 1;
  lVar5 = 0;
  auVar13._8_4_ = (int)apvStack_468;
  auVar13._0_8_ = apvStack_468;
  auVar13._12_4_ = (int)((ulong)apvStack_468 >> 0x20);
  do {
    (&local_4e8)[lVar5] = apvStack_468 + lVar9;
    alStack_4e0[lVar5] = lVar10 * 8 + auVar13._8_8_;
    lVar5 = lVar5 + 2;
    lVar9 = lVar9 + 2;
    lVar10 = lVar10 + 2;
  } while (lVar5 != 0x10);
  MultiANN::NearestNeighbor
            ((MultiANN *)local_228,(ANNpoint *)((long)&filename.field_2 + 8),&local_328,&local_3e8,
             &local_4e8);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cout,"Nearest Neighbors:",0x12);
  std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + '\b');
  std::ostream::put('\b');
  std::ostream::flush();
  lVar5 = 0;
  do {
    iVar1 = local_368[lVar5];
    poVar4 = std::ostream::_M_insert<double>((local_2a8[lVar5] * 180.0) / 3.141592653589793);
    std::__ostream_insert<char,std::char_traits<char>>(poVar4," deg: ",6);
    printPt((ostream *)&std::cout,*(ANNpoint *)((long)d_ann + (long)iVar1 * 8),4);
    lVar5 = lVar5 + 1;
  } while (lVar5 != 0x10);
  puStack_230 = (undefined1 *)0x105218;
  MultiANN::~MultiANN((MultiANN *)local_228);
  if (d_ann != 0.0) {
    puStack_230 = (undefined1 *)0x105226;
    operator_delete((void *)d_ann);
  }
  if (local_a8 != (undefined1  [8])0x0) {
    puStack_230 = (undefined1 *)0x10523b;
    operator_delete((void *)local_a8);
  }
  if (pointers_to_points.super__Vector_base<double_*,_std::allocator<double_*>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage != (pointer)&filename._M_string_length) {
    puStack_230 = (undefined1 *)0x105249;
    operator_delete(pointers_to_points.super__Vector_base<double_*,_std::allocator<double_*>_>.
                    _M_impl.super__Vector_impl_data._M_end_of_storage);
  }
  return 0;
}

Assistant:

int main(int argc, char **argv) {
    string filename;
    switch (argc) {
        case 1:
            cout << "Loading the quaternion file from disk..." << endl;
            filename = string("simple_0.qua");
            break;
        case 2:
            filename = string(argv[1]);
            break;
        default:
            cout << "Wrong number of arguments!" << endl;
            exit(EXIT_FAILURE);
    }
    auto cloud = load_quaternion_cloud(filename);

    int max_points = cloud.size();      // maximum number of data points
    int dimension = 4;            
    ANNpoint first_point = &(cloud[0].p[0]); 
    vector<double*> pointers_to_points;
    // ANN requires an entire vector of pointers even if the array is dense!
    for (int i = 0; i < max_points; i++) {
        pointers_to_points.push_back(first_point + 4*i);
    }
    ANNpointArray data_points = &pointers_to_points[0]; 

    cout << "Creating the search data structure..." << endl;
    int topology[] = {3, 3, 3, 3}; // Code for a single quaternion
    double _scale = 1.0;
    double scale[] = {_scale, _scale, _scale, _scale};
    int MaxNeighbors = 16;  // number of nearest neighbors
    MultiANN MAG(dimension, MaxNeighbors, topology, scale);
    for (int j = 0; j < max_points; j++) {
      MAG.AddPoint(data_points[j], data_points[j]);  
    }

    cout << "Generating Random Query Point" << endl;
    ANNpoint query_pt = annAllocPt(dimension);          // allocate query point
    //randomDistPoint(dimension, topology, query_pt);
    query_pt[0] = 0.0;
    query_pt[1] = 0.0;
    query_pt[2] = 0.0;
    query_pt[3] = 1.0;

    {
        cout << "Calling single point nearest neighbor..." << endl;
        double d_ann = INFINITY;
        int idx_ann;
        auto result_pt = (ANNpoint)MAG.NearestNeighbor(
            query_pt, idx_ann, d_ann);  // single nearest neighbor
        printPt(cout << "query_pt = ", query_pt, dimension);
        printPt(cout << "result_pt = ", result_pt, dimension);
        cout << "ANN distance = " << d_ann << " rad" << endl;
        double d_degrees = d_ann * 180.0 / PI;
        cout << "ANN distance = " << d_degrees << " degrees" << endl;
    }
    {
        cout << "Calling multiple point nearest neighbor..." << endl;
        double d_ann = INFINITY;

        double best_dist[MaxNeighbors];
        ANNpoint p_best_dist[MaxNeighbors];
        for(int i=0; i<MaxNeighbors; i++) p_best_dist[i] = best_dist+i;

        int best_neighbor_indeces[MaxNeighbors];
        int* p_best_neighbor_indeces[MaxNeighbors];
        for(int i=0; i<MaxNeighbors; i++) p_best_neighbor_indeces[i] = best_neighbor_indeces+i;
        void *best_ptr[MaxNeighbors];
        void **p_best_ptr[MaxNeighbors];
        for(int i=0; i<MaxNeighbors; i++) p_best_ptr[i] = best_ptr+i;
        MAG.NearestNeighbor(query_pt, p_best_dist[0], p_best_neighbor_indeces[0],
                            p_best_ptr[0]);  // multiple nearest neighbor

        cout << "Nearest Neighbors:" << endl;
        for(int i=0; i<MaxNeighbors; i++)
        {
          int best_neighbor_index = best_neighbor_indeces[i];
          //cout << "best_neighbor_index = " << best_neighbor_index << endl;
          cout << best_dist[i]*180.0/PI << " deg: ";
          printPt(cout, pointers_to_points[best_neighbor_index], dimension);
        }

    }
}